

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O2

void Kit_PlaToTruth(char *pSop,int nVars,Vec_Ptr_t *vVars,uint *pTemp,uint *pTruth)

{
  char cVar1;
  size_t sVar2;
  void *pvVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  int local_40;
  
  if (pSop == (char *)0x0) {
    __assert_fail("pSop != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kitPla.c"
                  ,499,
                  "void Kit_PlaToTruth(char *, int, Vec_Ptr_t *, unsigned int *, unsigned int *)");
  }
  if (nVars < 0) {
    __assert_fail("nVars >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kitPla.c"
                  ,500,
                  "void Kit_PlaToTruth(char *, int, Vec_Ptr_t *, unsigned int *, unsigned int *)");
  }
  sVar2 = strlen(pSop);
  uVar8 = (ulong)(nVars + 3);
  if (sVar2 % uVar8 == 0) {
    uVar6 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
    uVar7 = uVar6;
    if ((uint)nVars < 6) {
      uVar6 = 1;
      uVar7 = uVar6;
    }
    for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      pTruth[uVar6 - 1] = 0;
    }
    sVar2 = strlen(pSop);
    bVar9 = false;
    for (iVar5 = 0; local_40 = (int)(sVar2 / uVar8), iVar5 < local_40; iVar5 = iVar5 + 1) {
      cVar1 = pSop[(ulong)(uint)nVars + 1];
      for (uVar6 = uVar7; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
        pTemp[uVar6 - 1] = 0xffffffff;
      }
      for (uVar6 = 0; uVar4 = uVar7, uVar6 != (uint)nVars; uVar6 = uVar6 + 1) {
        if (pSop[uVar6] == '0') {
          pvVar3 = Vec_PtrEntry(vVars,(int)uVar6);
          for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
            pTemp[uVar4 - 1] = pTemp[uVar4 - 1] & ~*(uint *)((long)pvVar3 + uVar4 * 4 + -4);
          }
        }
        else if (pSop[uVar6] == '1') {
          pvVar3 = Vec_PtrEntry(vVars,(int)uVar6);
          for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
            pTemp[uVar4 - 1] = pTemp[uVar4 - 1] & *(uint *)((long)pvVar3 + uVar4 * 4 + -4);
          }
        }
      }
      for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
        pTruth[uVar4 - 1] = pTruth[uVar4 - 1] | pTemp[uVar4 - 1];
      }
      bVar9 = cVar1 == '0';
      pSop = pSop + uVar8;
    }
    if (bVar9) {
      for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
        pTruth[uVar7 - 1] = ~pTruth[uVar7 - 1];
      }
    }
    return;
  }
  puts("Kit_PlaToTruth(): SOP is represented incorrectly.");
  return;
}

Assistant:

void Kit_PlaToTruth( char * pSop, int nVars, Vec_Ptr_t * vVars, unsigned * pTemp, unsigned * pTruth )
{
    int v, c, nCubes, fCompl = 0;
    assert( pSop != NULL );
    assert( nVars >= 0 );
    if ( strlen(pSop) % (nVars + 3) != 0 )
    {
        printf( "Kit_PlaToTruth(): SOP is represented incorrectly.\n" );
        return;
    }
    // iterate through the cubes
    Kit_TruthClear( pTruth, nVars );
    nCubes =  strlen(pSop) / (nVars + 3);
    for ( c = 0; c < nCubes; c++ )
    {
        fCompl = (pSop[nVars+1] == '0');
        Kit_TruthFill( pTemp, nVars );
        // iterate through the literals of the cube
        for ( v = 0; v < nVars; v++ )
            if ( pSop[v] == '1' )
                Kit_TruthAnd( pTemp, pTemp, (unsigned *)Vec_PtrEntry(vVars, v), nVars );
            else if ( pSop[v] == '0' )
                Kit_TruthSharp( pTemp, pTemp, (unsigned *)Vec_PtrEntry(vVars, v), nVars );
        // add cube to storage
        Kit_TruthOr( pTruth, pTruth, pTemp, nVars );
        // go to the next cube
        pSop += (nVars + 3);
    }
    if ( fCompl )
        Kit_TruthNot( pTruth, pTruth, nVars );
}